

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::assign_conv_bias_gradient(tensor *grad,tensor *gradient_input)

{
  uint *puVar1;
  float fVar2;
  int iVar3;
  undefined4 extraout_var;
  float *pfVar5;
  ostream *poVar6;
  fatal_error *this;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  string sStack_1b8;
  ostringstream dlib_o_out;
  uint auStack_180 [88];
  long lVar4;
  undefined4 extraout_var_00;
  
  if ((((grad->m_n == 1) && (0 < grad->m_k)) && (grad->m_nr == 1)) &&
     (((grad->m_nc == 1 && (grad != gradient_input)) &&
      ((gradient_input->m_k == grad->m_k && (gradient_input->m_size != 0)))))) {
    iVar3 = (*grad->_vptr_tensor[3])();
    lVar4 = CONCAT44(extraout_var,iVar3);
    iVar3 = (*gradient_input->_vptr_tensor[2])();
    pfVar5 = (float *)CONCAT44(extraout_var_00,iVar3);
    lVar8 = 0;
    lVar7 = gradient_input->m_k;
    if (gradient_input->m_k < 1) {
      lVar7 = lVar8;
    }
    for (; lVar7 != lVar8; lVar8 = lVar8 + 1) {
      *(undefined4 *)(lVar4 + lVar8 * 4) = 0;
    }
    lVar9 = 0;
    lVar8 = gradient_input->m_n;
    if (gradient_input->m_n < 1) {
      lVar8 = lVar9;
    }
    for (lVar10 = 0; lVar10 != lVar8; lVar10 = lVar10 + 1) {
      lVar11 = gradient_input->m_nr;
      if (gradient_input->m_nr < 1) {
        lVar11 = lVar9;
      }
      for (lVar12 = 0; lVar12 != lVar7; lVar12 = lVar12 + 1) {
        lVar13 = gradient_input->m_nc;
        if (gradient_input->m_nc < 1) {
          lVar13 = lVar9;
        }
        for (lVar14 = 0; lVar15 = lVar13, lVar14 != lVar11; lVar14 = lVar14 + 1) {
          while (lVar15 != 0) {
            fVar2 = *pfVar5;
            pfVar5 = pfVar5 + 1;
            *(float *)(lVar4 + lVar12 * 4) = fVar2 + *(float *)(lVar4 + lVar12 * 4);
            lVar15 = lVar15 + -1;
          }
        }
      }
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar6 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x17f);
  std::operator<<(poVar6,".\n");
  poVar6 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar6,".\n");
  poVar6 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar6 = std::operator<<(poVar6,
                           "void dlib::cpu::assign_conv_bias_gradient(tensor &, const tensor &)");
  std::operator<<(poVar6,".\n\n");
  poVar6 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar6 = std::operator<<(poVar6,
                           "grad.num_samples() == 1 && grad.k() >= 1 && grad.nr() == 1 && grad.nc() == 1 && gradient_input.k() == grad.k() && gradient_input.size() > 0 && is_same_object(grad,gradient_input) == false"
                          );
  std::operator<<(poVar6,".\n");
  puVar1 = (uint *)((long)auStack_180 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar6 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar6,"\n");
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&sStack_1b8);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void assign_conv_bias_gradient (
            tensor& grad,
            const tensor& gradient_input
        )
        {
            DLIB_CASSERT(
                  grad.num_samples() == 1 &&
                  grad.k()  >= 1 &&
                  grad.nr() == 1 &&
                  grad.nc() == 1 &&
                  gradient_input.k() == grad.k() &&
                  gradient_input.size() > 0 && 
                  is_same_object(grad,gradient_input) == false
                  );

            auto g = grad.host();
            auto gi = gradient_input.host();

            for (long k = 0; k < gradient_input.k(); ++k)
                g[k] = 0;

            for (long n = 0; n < gradient_input.num_samples(); ++n)
            {
                for (long k = 0; k < gradient_input.k(); ++k)
                {
                    for (long r = 0; r < gradient_input.nr(); ++r)
                    {
                        for (long c = 0; c < gradient_input.nc(); ++c)
                        {
                            g[k] += (*gi++);
                        }
                    }
                }
            }
        }